

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberformatter.h
# Opt level: O1

void __thiscall icu_63::number::impl::MacroProps::MacroProps(MacroProps *this,MacroProps *param_1)

{
  AffixPatternProvider *pAVar1;
  PluralRules *pPVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  UNumberSignDisplay UVar5;
  long lVar6;
  Precision *pPVar7;
  Precision *pPVar8;
  byte bVar9;
  
  bVar9 = 0;
  (this->notation).fUnion.scientific.fExponentSignDisplay =
       (param_1->notation).fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)&this->notation = *(undefined8 *)&param_1->notation;
  MeasureUnit::MeasureUnit(&this->unit,&param_1->unit);
  MeasureUnit::MeasureUnit(&this->perUnit,&param_1->perUnit);
  pPVar7 = &param_1->precision;
  pPVar8 = &this->precision;
  for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar4 = *(undefined4 *)&pPVar7->field_0x4;
    pPVar8->fType = pPVar7->fType;
    *(undefined4 *)&pPVar8->field_0x4 = uVar4;
    pPVar7 = (Precision *)((long)pPVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    pPVar8 = (Precision *)((long)pPVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  (this->integerWidth).fHasError = (param_1->integerWidth).fHasError;
  *(undefined4 *)((long)&(this->integerWidth).fUnion + 4) =
       *(undefined4 *)((long)&(param_1->integerWidth).fUnion + 4);
  SymbolsWrapper::doCopyFrom(&this->symbols,&param_1->symbols);
  this->decimal = param_1->decimal;
  UVar5 = param_1->sign;
  this->unitWidth = param_1->unitWidth;
  this->sign = UVar5;
  Scale::Scale(&this->scale,&param_1->scale);
  pAVar1 = param_1->affixProvider;
  pPVar2 = param_1->rules;
  uVar3 = *(undefined8 *)((long)&param_1->currencySymbols + 4);
  *(undefined8 *)((long)&this->rules + 4) = *(undefined8 *)((long)&param_1->rules + 4);
  *(undefined8 *)((long)&this->currencySymbols + 4) = uVar3;
  this->affixProvider = pAVar1;
  this->rules = pPVar2;
  Locale::Locale(&this->locale,&param_1->locale);
  return;
}

Assistant:

struct U_I18N_API MacroProps : public UMemory {
    /** @internal */
    Notation notation;

    /** @internal */
    MeasureUnit unit; // = NoUnit::base();

    /** @internal */
    MeasureUnit perUnit; // = NoUnit::base();

    /** @internal */
    Precision precision;  // = Precision();  (bogus)

    /** @internal */
    UNumberFormatRoundingMode roundingMode = UNUM_ROUND_HALFEVEN;

    /** @internal */
    Grouper grouper;  // = Grouper();  (bogus)

    /** @internal */
    Padder padder;    // = Padder();   (bogus)

    /** @internal */
    IntegerWidth integerWidth; // = IntegerWidth(); (bogus)

    /** @internal */
    SymbolsWrapper symbols;

    // UNUM_XYZ_COUNT denotes null (bogus) values.

    /** @internal */
    UNumberUnitWidth unitWidth = UNUM_UNIT_WIDTH_COUNT;

    /** @internal */
    UNumberSignDisplay sign = UNUM_SIGN_COUNT;

    /** @internal */
    UNumberDecimalSeparatorDisplay decimal = UNUM_DECIMAL_SEPARATOR_COUNT;

    /** @internal */
    Scale scale;  // = Scale();  (benign value)

    /** @internal */
    const AffixPatternProvider* affixProvider = nullptr;  // no ownership

    /** @internal */
    const PluralRules* rules = nullptr;  // no ownership

    /** @internal */
    const CurrencySymbols* currencySymbols = nullptr;  // no ownership

    /** @internal */
    int32_t threshold = DEFAULT_THRESHOLD;

    /** @internal */
    Locale locale;

    // NOTE: Uses default copy and move constructors.

    /**
     * Check all members for errors.
     * @internal
     */
    bool copyErrorTo(UErrorCode &status) const {
        return notation.copyErrorTo(status) || precision.copyErrorTo(status) ||
               padder.copyErrorTo(status) || integerWidth.copyErrorTo(status) ||
               symbols.copyErrorTo(status) || scale.copyErrorTo(status);
    }
}